

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall SubprocessTestSetWithSingle::Run(SubprocessTestSetWithSingle *this)

{
  SubprocessSet *this_00;
  Test *pTVar1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *this_01;
  string *__rhs;
  size_type sVar4;
  allocator<char> local_41;
  string local_40;
  
  this_00 = &(this->super_SubprocessTest).subprocs_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"ls /",&local_41);
  this_01 = SubprocessSet::Add(this_00,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  bVar2 = testing::Test::Check
                    (g_current_test,this_01 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0xa8,"(Subprocess *) 0 != subproc");
  if (bVar2) {
    while (bVar2 = Subprocess::Done(this_01), pTVar1 = g_current_test, !bVar2) {
      SubprocessSet::DoWork(this_00);
    }
    EVar3 = Subprocess::Finish(this_01);
    bVar2 = testing::Test::Check
                      (pTVar1,EVar3 == ExitSuccess,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                       ,0xad,"ExitSuccess == subproc->Finish()");
    pTVar1 = g_current_test;
    if (bVar2) {
      __rhs = Subprocess::GetOutput_abi_cxx11_(this_01);
      bVar2 = std::operator!=("",__rhs);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                         ,0xae,"\"\" != subproc->GetOutput()");
      pTVar1 = g_current_test;
      if (bVar2) {
        sVar4 = std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                          (&(this->super_SubprocessTest).subprocs_.finished_.c);
        bVar2 = testing::Test::Check
                          (pTVar1,sVar4 == 1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                           ,0xb0,"1u == subprocs_.finished_.size()");
        if (bVar2) {
          return;
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(SubprocessTest, SetWithSingle) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    subprocs_.DoWork();
  }
  ASSERT_EQ(ExitSuccess, subproc->Finish());
  ASSERT_NE("", subproc->GetOutput());

  ASSERT_EQ(1u, subprocs_.finished_.size());
}